

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serfloat_tests.cpp
# Opt level: O1

void __thiscall serfloat_tests::double_serfloat_tests::test_method(double_serfloat_tests *this)

{
  double f;
  long lVar1;
  uint uVar2;
  int j;
  int iVar3;
  double dVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  int x;
  uint uVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined8 local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  uint64_t local_f8;
  lazy_ostream local_f0;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined8 *local_b0;
  undefined **local_a8;
  undefined1 local_a0;
  undefined1 *local_98;
  undefined8 **local_90;
  uint64_t *local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined1 *local_70;
  uint64_t **local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x29;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(0.0);
  local_88 = &local_f8;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0);
  local_b0 = &local_120;
  local_120 = (ulong)local_120._4_4_ << 0x20;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_68 = &local_88;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3d30;
  local_98 = boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34587,(size_t)&local_60,0x29,&local_80,"0U",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2a;
  file_00.m_begin = (iterator)&local_108;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_118,
             msg_00);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-0.0);
  local_120 = 0x8000000000000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34597,(size_t)&local_60,0x2a,&local_80,
             "0x8000000000000000",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x2b;
  file_01.m_begin = (iterator)&local_130;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_140,
             msg_01);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(INFINITY);
  local_120 = 0x7ff0000000000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x7ff0000000000000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf345bb,(size_t)&local_60,0x2b,&local_80,
             "0x7ff0000000000000U",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x2c;
  file_02.m_begin = (iterator)&local_150;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_160,
             msg_02);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-INFINITY);
  local_120 = 0xfff0000000000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xfff0000000000000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34603,(size_t)&local_60,0x2c,&local_80,
             "0xfff0000000000000",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x2d;
  file_03.m_begin = (iterator)&local_170;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_180,
             msg_03);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(0.5);
  local_120 = 0x3fe0000000000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x3fe0000000000000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d5690;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf3464b,(size_t)&local_60,0x2d,&local_80,
             "0x3fe0000000000000ULL",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x2e;
  file_04.m_begin = (iterator)&local_190;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1a0,
             msg_04);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(1.0);
  local_120 = 0x3ff0000000000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x3ff0000000000000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d5690;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34671,(size_t)&local_60,0x2e,&local_80,
             "0x3ff0000000000000ULL",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x2f;
  file_05.m_begin = (iterator)&local_1b0;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1c0,
             msg_05);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(2.0);
  local_120 = 0x4000000000000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x4000000000000000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d5690;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34697,(size_t)&local_60,0x2f,&local_80,
             "0x4000000000000000ULL",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x30;
  file_06.m_begin = (iterator)&local_1d0;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1e0,
             msg_06);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(4.0);
  local_120 = 0x4010000000000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x4010000000000000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d5690;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf346bd,(size_t)&local_60,0x30,&local_80,
             "0x4010000000000000ULL",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x31;
  file_07.m_begin = (iterator)&local_1f0;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_200,
             msg_07);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(785.066650390625);
  local_120 = 0x4088888880000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x4088888880000000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d5690;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf346e3,(size_t)&local_60,0x31,&local_80,
             "0x4088888880000000ULL",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x32;
  file_08.m_begin = (iterator)&local_210;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_220,
             msg_08);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(3.7243058682384174);
  local_120 = 0x400dcb60e0031440;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x400dcb60e0031440);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34716,(size_t)&local_60,0x32,&local_80,
             "0x400dcb60e0031440",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x33;
  file_09.m_begin = (iterator)&local_230;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_240,
             msg_09);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(91.64070592566159);
  local_120 = 0x4056e901536d447a;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x4056e901536d447a);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34748,(size_t)&local_60,0x33,&local_80,
             "0x4056e901536d447a",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x34;
  file_10.m_begin = (iterator)&local_250;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_260,
             msg_10);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-98.63087668642575);
  local_120 = 0xc058a860489c007a;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xc058a860489c007a);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34779,(size_t)&local_60,0x34,&local_80,
             "0xc058a860489c007a",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x35;
  file_11.m_begin = (iterator)&local_270;
  msg_11.m_end = pvVar6;
  msg_11.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_280,
             msg_11);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(4.908737756962054);
  local_120 = 0x4013a28c268b2b70;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x4013a28c268b2b70);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf347ab,(size_t)&local_60,0x35,&local_80,
             "0x4013a28c268b2b70",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x36;
  file_12.m_begin = (iterator)&local_290;
  msg_12.m_end = pvVar6;
  msg_12.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_2a0,
             msg_12);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(77.9247330021754);
  local_120 = 0x40537b2ed3547804;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x40537b2ed3547804);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf347dc,(size_t)&local_60,0x36,&local_80,
             "0x40537b2ed3547804",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x37;
  file_13.m_begin = (iterator)&local_2b0;
  msg_13.m_end = pvVar6;
  msg_13.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_2c0,
             msg_13);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(40.24732825357566);
  local_120 = 0x40441fa873c43dfc;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x40441fa873c43dfc);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf3480c,(size_t)&local_60,0x37,&local_80,
             "0x40441fa873c43dfc",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x38;
  file_14.m_begin = (iterator)&local_2d0;
  msg_14.m_end = pvVar6;
  msg_14.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_2e0,
             msg_14);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(71.39395607929222);
  local_120 = 0x4051d936938f27b6;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x4051d936938f27b6);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf3483d,(size_t)&local_60,0x38,&local_80,
             "0x4051d936938f27b6",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x39;
  file_15.m_begin = (iterator)&local_2f0;
  msg_15.m_end = pvVar6;
  msg_15.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_300,
             msg_15);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(58.80100710817612);
  local_120 = 0x404d668766a2bd70;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x404d668766a2bd70);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf3486e,(size_t)&local_60,0x39,&local_80,
             "0x404d668766a2bd70",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x3a;
  file_16.m_begin = (iterator)&local_310;
  msg_16.m_end = pvVar6;
  msg_16.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_320,
             msg_16);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-30.10665786964975);
  local_120 = 0xc03e1b4dee1e01b8;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xc03e1b4dee1e01b8);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf3489f,(size_t)&local_60,0x3a,&local_80,
             "0xc03e1b4dee1e01b8",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x3b;
  file_17.m_begin = (iterator)&local_330;
  msg_17.m_end = pvVar6;
  msg_17.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_340,
             msg_17);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(60.15231509068704);
  local_120 = 0x404e137f0f969814;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x404e137f0f969814);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf348d1,(size_t)&local_60,0x3b,&local_80,
             "0x404e137f0f969814",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x3c;
  file_18.m_begin = (iterator)&local_350;
  msg_18.m_end = pvVar6;
  msg_18.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_360,
             msg_18);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-48.15848711335961);
  local_120 = 0xc04814494e445bc6;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xc04814494e445bc6);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34902,(size_t)&local_60,0x3c,&local_80,
             "0xc04814494e445bc6",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x3d;
  file_19.m_begin = (iterator)&local_370;
  msg_19.m_end = pvVar6;
  msg_19.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_380,
             msg_19);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(26.68450101125353);
  local_120 = 0x403aaf3b755169b0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x403aaf3b755169b0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34934,(size_t)&local_60,0x3d,&local_80,
             "0x403aaf3b755169b0",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x3e;
  file_20.m_begin = (iterator)&local_390;
  msg_20.m_end = pvVar6;
  msg_20.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_3a0,
             msg_20);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-65.72071986604303);
  local_120 = 0xc0506e2046378ede;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xc0506e2046378ede);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34965,(size_t)&local_60,0x3e,&local_80,
             "0xc0506e2046378ede",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x3f;
  file_21.m_begin = (iterator)&local_3b0;
  msg_21.m_end = pvVar6;
  msg_21.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_3c0,
             msg_21);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(17.95575825512381);
  local_120 = 0x4031f4ac92b0a388;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x4031f4ac92b0a388);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34997,(size_t)&local_60,0x3f,&local_80,
             "0x4031f4ac92b0a388",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x40;
  file_22.m_begin = (iterator)&local_3d0;
  msg_22.m_end = pvVar6;
  msg_22.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_3e0,
             msg_22);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-35.27171863226279);
  local_120 = 0xc041a2c7ad17a42a;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xc041a2c7ad17a42a);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf349c8,(size_t)&local_60,0x40,&local_80,
             "0xc041a2c7ad17a42a",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x41;
  file_23.m_begin = (iterator)&local_3f0;
  msg_23.m_end = pvVar6;
  msg_23.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_400,
             msg_23);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-8.58810329425124);
  local_120 = 0xc0212d1bdffef538;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xc0212d1bdffef538);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf349fa,(size_t)&local_60,0x41,&local_80,
             "0xc0212d1bdffef538",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x42;
  file_24.m_begin = (iterator)&local_410;
  msg_24.m_end = pvVar6;
  msg_24.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_420,
             msg_24);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(88.51393044338977);
  local_120 = 0x405620e43c83b1c8;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x405620e43c83b1c8);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34a2b,(size_t)&local_60,0x42,&local_80,
             "0x405620e43c83b1c8",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x43;
  file_25.m_begin = (iterator)&local_430;
  msg_25.m_end = pvVar6;
  msg_25.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_440,
             msg_25);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(48.07224932612732);
  local_120 = 0x4048093f77466ffc;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x4048093f77466ffc);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34a5c,(size_t)&local_60,0x43,&local_80,
             "0x4048093f77466ffc",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x44;
  file_26.m_begin = (iterator)&local_450;
  msg_26.m_end = pvVar6;
  msg_26.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_460,
             msg_26);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(9.867348871395659e+117);
  local_120 = 0x586f4daeb2459b9f;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x586f4daeb2459b9f);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34a8d,(size_t)&local_60,0x44,&local_80,
             "0x586f4daeb2459b9f",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x45;
  file_27.m_begin = (iterator)&local_470;
  msg_27.m_end = pvVar6;
  msg_27.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_480,
             msg_27);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-1.5166424385129721e+206);
  local_120 = 0xeabe3bbc484bd458;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xeabe3bbc484bd458);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34ac3,(size_t)&local_60,0x45,&local_80,
             "0xeabe3bbc484bd458",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x46;
  file_28.m_begin = (iterator)&local_490;
  msg_28.m_end = pvVar6;
  msg_28.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_4a0,
             msg_28);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-8.585156555624594e-275);
  local_120 = 0x8707c76eee012429;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x8707c76eee012429);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34afb,(size_t)&local_60,0x46,&local_80,
             "0x8707c76eee012429",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x47;
  file_29.m_begin = (iterator)&local_4b0;
  msg_29.m_end = pvVar6;
  msg_29.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_4c0,
             msg_29);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(2.2794371091628822e+113);
  local_120 = 0x5777b2184458f4ee;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x5777b2184458f4ee);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34b32,(size_t)&local_60,0x47,&local_80,
             "0x5777b2184458f4ee",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x48;
  file_30.m_begin = (iterator)&local_4d0;
  msg_30.m_end = pvVar6;
  msg_30.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_4e0,
             msg_30);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-1.1290476594131867e+163);
  local_120 = 0xe1c91893d3488bb0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xe1c91893d3488bb0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34b69,(size_t)&local_60,0x48,&local_80,
             "0xe1c91893d3488bb0",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x49;
  file_31.m_begin = (iterator)&local_4f0;
  msg_31.m_end = pvVar6;
  msg_31.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_500,
             msg_31);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(9.143848423979275e-246);
  local_120 = 0xd0ff76e5f2620a3;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xd0ff76e5f2620a3);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34ba1,(size_t)&local_60,0x49,&local_80,
             "0x0d0ff76e5f2620a3",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x4a;
  file_32.m_begin = (iterator)&local_510;
  msg_32.m_end = pvVar6;
  msg_32.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_520,
             msg_32);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-2.8366718125941117e+81);
  local_120 = 0xd0d7ec7e754b394a;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xd0d7ec7e754b394a);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34bd7,(size_t)&local_60,0x4a,&local_80,
             "0xd0d7ec7e754b394a",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x4b;
  file_33.m_begin = (iterator)&local_530;
  msg_33.m_end = pvVar6;
  msg_33.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_540,
             msg_33);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-1.2754409481684012e+229);
  local_120 = 0xef80d32f8ec55342;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xef80d32f8ec55342);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34c0e,(size_t)&local_60,0x4b,&local_80,
             "0xef80d32f8ec55342",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x4c;
  file_34.m_begin = (iterator)&local_550;
  msg_34.m_end = pvVar6;
  msg_34.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_560,
             msg_34);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(6.000577060053642e-186);
  local_120 = 0x197a1be7c8209b6a;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x197a1be7c8209b6a);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34c46,(size_t)&local_60,0x4c,&local_80,
             "0x197a1be7c8209b6a",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x4d;
  file_35.m_begin = (iterator)&local_570;
  msg_35.m_end = pvVar6;
  msg_35.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_580,
             msg_35);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(2.0839423284378986e-302);
  local_120 = 0x14c94f8689cb0a5;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x14c94f8689cb0a5);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34c7c,(size_t)&local_60,0x4d,&local_80,
             "0x014c94f8689cb0a5",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x4e;
  file_36.m_begin = (iterator)&local_590;
  msg_36.m_end = pvVar6;
  msg_36.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_5a0,
             msg_36);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-1.422140051483753e+259);
  local_120 = 0xf5bd99271d04bb35;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xf5bd99271d04bb35);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34cb3,(size_t)&local_60,0x4e,&local_80,
             "0xf5bd99271d04bb35",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x4f;
  file_37.m_begin = (iterator)&local_5b0;
  msg_37.m_end = pvVar6;
  msg_37.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_5c0,
             msg_37);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-1.0593973991188853e+46);
  local_120 = 0xc97db0cdb72d1046;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xc97db0cdb72d1046);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34cea,(size_t)&local_60,0x4f,&local_80,
             "0xc97db0cdb72d1046",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = &DAT_00000050;
  file_38.m_begin = (iterator)&local_5d0;
  msg_38.m_end = pvVar6;
  msg_38.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_5e0,
             msg_38);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(2.62945125875249e+190);
  local_120 = 0x67779b36366c993b;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x67779b36366c993b);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34d21,(size_t)&local_60,0x50,&local_80,
             "0x67779b36366c993b",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x51;
  file_39.m_begin = (iterator)&local_5f0;
  msg_39.m_end = pvVar6;
  msg_39.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_600,
             msg_39);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-2.920377657275094e+115);
  local_120 = 0xd7e7b7b45908e23b;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xd7e7b7b45908e23b);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34d56,(size_t)&local_60,0x51,&local_80,
             "0xd7e7b7b45908e23b",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x52;
  file_40.m_begin = (iterator)&local_610;
  msg_40.m_end = pvVar6;
  msg_40.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_620,
             msg_40);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(9.790289014855851e-118);
  local_120 = 0x27a3c031cc428bcc;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x27a3c031cc428bcc);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34d8d,(size_t)&local_60,0x52,&local_80,
             "0x27a3c031cc428bcc",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_630 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_628 = "";
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x53;
  file_41.m_begin = (iterator)&local_630;
  msg_41.m_end = pvVar6;
  msg_41.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_640,
             msg_41);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-4.629317182034961e-114);
  local_120 = 0xa866ccf0b753705a;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xa866ccf0b753705a);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34dc3,(size_t)&local_60,0x53,&local_80,
             "0xa866ccf0b753705a",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_650 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_648 = "";
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x54;
  file_42.m_begin = (iterator)&local_650;
  msg_42.m_end = pvVar6;
  msg_42.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_660,
             msg_42);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-1.7674605603846528e+279);
  local_120 = 0xf9e8ed383ffc3e25;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xf9e8ed383ffc3e25);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34dfa,(size_t)&local_60,0x54,&local_80,
             "0xf9e8ed383ffc3e25",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0x55;
  file_43.m_begin = (iterator)&local_670;
  msg_43.m_end = pvVar6;
  msg_43.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_680,
             msg_43);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(2.5308171727712605e+120);
  local_120 = 0x58ef5cd55f0ec997;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x58ef5cd55f0ec997);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34e32,(size_t)&local_60,0x55,&local_80,
             "0x58ef5cd55f0ec997",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_688 = "";
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x56;
  file_44.m_begin = (iterator)&local_690;
  msg_44.m_end = pvVar6;
  msg_44.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_6a0,
             msg_44);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-1.05034156412799e+54);
  local_120 = 0xcb25eea1b9350fa0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xcb25eea1b9350fa0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34e69,(size_t)&local_60,0x56,&local_80,
             "0xcb25eea1b9350fa0",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_6b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_45.m_end = (iterator)0x59;
  file_45.m_begin = (iterator)&local_6b0;
  msg_45.m_end = pvVar6;
  msg_45.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_6c0,
             msg_45);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(2.2250738585072014e-308);
  local_120 = 0x10000000000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x10000000000000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34e9e,(size_t)&local_60,0x59,&local_80,
             "0x10000000000000",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0x5a;
  file_46.m_begin = (iterator)&local_6d0;
  msg_46.m_end = pvVar6;
  msg_46.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_6e0,
             msg_46);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-2.2250738585072014e-308);
  local_120 = 0x8010000000000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x8010000000000000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34ede,(size_t)&local_60,0x5a,&local_80,
             "0x8010000000000000",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_47.m_end = (iterator)0x5b;
  file_47.m_begin = (iterator)&local_6f0;
  msg_47.m_end = pvVar6;
  msg_47.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_700,
             msg_47);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(1.79769313486232e+308);
  local_120 = 0x7fefffffffffffff;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x7fefffffffffffff);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34f21,(size_t)&local_60,0x5b,&local_80,
             "0x7fefffffffffffff",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_710 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_708 = "";
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  file_48.m_end = (iterator)0x5c;
  file_48.m_begin = (iterator)&local_710;
  msg_48.m_end = pvVar6;
  msg_48.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_720,
             msg_48);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-1.79769313486232e+308);
  local_120 = 0xffefffffffffffff;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xffefffffffffffff);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34f63,(size_t)&local_60,0x5c,&local_80,
             "0xffefffffffffffff",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_728 = "";
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  file_49.m_end = (iterator)0x5d;
  file_49.m_begin = (iterator)&local_730;
  msg_49.m_end = pvVar6;
  msg_49.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_740,
             msg_49);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-1.79769313486232e+308);
  local_120 = 0xffefffffffffffff;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xffefffffffffffff);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34fa6,(size_t)&local_60,0x5d,&local_80,
             "0xffefffffffffffff",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_750 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  file_50.m_end = (iterator)0x5e;
  file_50.m_begin = (iterator)&local_750;
  msg_50.m_end = pvVar6;
  msg_50.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_760,
             msg_50);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(1.79769313486232e+308);
  local_120 = 0x7fefffffffffffff;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x7fefffffffffffff);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf34fd8,(size_t)&local_60,0x5e,&local_80,
             "0x7fefffffffffffff",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_770 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_768 = "";
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  file_51.m_end = (iterator)0x5f;
  file_51.m_begin = (iterator)&local_770;
  msg_51.m_end = pvVar6;
  msg_51.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_780,
             msg_51);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(4.94065645841247e-324);
  local_120 = CONCAT44(local_120._4_4_,1);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 1);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3e70;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf3500b,(size_t)&local_60,0x5f,&local_80,"0x1",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_790 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_788 = "";
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  file_52.m_end = (iterator)0x60;
  file_52.m_begin = (iterator)&local_790;
  msg_52.m_end = pvVar6;
  msg_52.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_7a0,
             msg_52);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-4.94065645841247e-324);
  local_120 = 0x8000000000000001;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x8000000000000001);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d3cf0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf35041,(size_t)&local_60,0x60,&local_80,
             "0x8000000000000001",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_7b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_53.m_end = (iterator)0x62;
  file_53.m_begin = (iterator)&local_7b0;
  msg_53.m_end = pvVar6;
  msg_53.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_7c0,
             msg_53);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(NAN);
  local_120 = 0x7ff8000000000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x7ff8000000000000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf3508b,(size_t)&local_60,0x62,&local_80,
             "0x7ff8000000000000",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_7d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_7c8 = "";
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_54.m_end = (iterator)0x63;
  file_54.m_begin = (iterator)&local_7d0;
  msg_54.m_end = pvVar6;
  msg_54.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_7e0,
             msg_54);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-NAN);
  local_120 = 0x7ff8000000000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x7ff8000000000000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf350d3,(size_t)&local_60,99,&local_80,
             "0x7ff8000000000000",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_7f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_7e8 = "";
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_55.m_end = (iterator)0x64;
  file_55.m_begin = (iterator)&local_7f0;
  msg_55.m_end = pvVar6;
  msg_55.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_800,
             msg_55);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(NAN);
  local_120 = 0x7ff8000000000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x7ff8000000000000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf35109,(size_t)&local_60,100,&local_80,
             "0x7ff8000000000000",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_810 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  file_56.m_end = (iterator)0x65;
  file_56.m_begin = (iterator)&local_810;
  msg_56.m_end = pvVar6;
  msg_56.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_820,
             msg_56);
  local_f0.m_empty = false;
  local_f0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_f8 = anon_unknown_4::TestDouble(-NAN);
  local_120 = 0x7ff8000000000000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x7ff8000000000000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
  ;
  local_58 = "";
  local_88 = &local_f8;
  iVar3 = 0;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_013d3cf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_120;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013d4050;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,&local_f0,1,2,REQUIRE,0xf35142,(size_t)&local_60,0x65,&local_80,
             "0x7ff8000000000000",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  do {
    uVar7 = 0;
    do {
      f = (double)FastRandomContext::rand64(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng);
      lVar1 = 0;
      uVar2 = 0;
      do {
        dVar4 = (double)((ulong)f & ~(1L << ((ulong)(byte)(&DAT_00f35204)[lVar1] & 0x3f)));
        f = (double)((ulong)f | 1L << ((ulong)(byte)(&DAT_00f35204)[lVar1] & 0x3f));
        if ((uVar7 >> (uVar2 & 0x1f) & 1) == 0) {
          f = dVar4;
        }
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 4;
      } while (lVar1 != 0x24);
      anon_unknown_4::TestDouble(f);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x200);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 1000);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(double_serfloat_tests) {
    // Test specific values against their expected encoding.
    BOOST_CHECK_EQUAL(TestDouble(0.0), 0U);
    BOOST_CHECK_EQUAL(TestDouble(-0.0), 0x8000000000000000);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::infinity()), 0x7ff0000000000000U);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::infinity()), 0xfff0000000000000);
    BOOST_CHECK_EQUAL(TestDouble(0.5), 0x3fe0000000000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(1.0), 0x3ff0000000000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(2.0), 0x4000000000000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(4.0), 0x4010000000000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(785.066650390625), 0x4088888880000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(3.7243058682384174), 0x400dcb60e0031440);
    BOOST_CHECK_EQUAL(TestDouble(91.64070592566159), 0x4056e901536d447a);
    BOOST_CHECK_EQUAL(TestDouble(-98.63087668642575), 0xc058a860489c007a);
    BOOST_CHECK_EQUAL(TestDouble(4.908737756962054), 0x4013a28c268b2b70);
    BOOST_CHECK_EQUAL(TestDouble(77.9247330021754), 0x40537b2ed3547804);
    BOOST_CHECK_EQUAL(TestDouble(40.24732825357566), 0x40441fa873c43dfc);
    BOOST_CHECK_EQUAL(TestDouble(71.39395607929222), 0x4051d936938f27b6);
    BOOST_CHECK_EQUAL(TestDouble(58.80100710817612), 0x404d668766a2bd70);
    BOOST_CHECK_EQUAL(TestDouble(-30.10665786964975), 0xc03e1b4dee1e01b8);
    BOOST_CHECK_EQUAL(TestDouble(60.15231509068704), 0x404e137f0f969814);
    BOOST_CHECK_EQUAL(TestDouble(-48.15848711335961), 0xc04814494e445bc6);
    BOOST_CHECK_EQUAL(TestDouble(26.68450101125353), 0x403aaf3b755169b0);
    BOOST_CHECK_EQUAL(TestDouble(-65.72071986604303), 0xc0506e2046378ede);
    BOOST_CHECK_EQUAL(TestDouble(17.95575825512381), 0x4031f4ac92b0a388);
    BOOST_CHECK_EQUAL(TestDouble(-35.27171863226279), 0xc041a2c7ad17a42a);
    BOOST_CHECK_EQUAL(TestDouble(-8.58810329425124), 0xc0212d1bdffef538);
    BOOST_CHECK_EQUAL(TestDouble(88.51393044338977), 0x405620e43c83b1c8);
    BOOST_CHECK_EQUAL(TestDouble(48.07224932612732), 0x4048093f77466ffc);
    BOOST_CHECK_EQUAL(TestDouble(9.867348871395659e+117), 0x586f4daeb2459b9f);
    BOOST_CHECK_EQUAL(TestDouble(-1.5166424385129721e+206), 0xeabe3bbc484bd458);
    BOOST_CHECK_EQUAL(TestDouble(-8.585156555624594e-275), 0x8707c76eee012429);
    BOOST_CHECK_EQUAL(TestDouble(2.2794371091628822e+113), 0x5777b2184458f4ee);
    BOOST_CHECK_EQUAL(TestDouble(-1.1290476594131867e+163), 0xe1c91893d3488bb0);
    BOOST_CHECK_EQUAL(TestDouble(9.143848423979275e-246), 0x0d0ff76e5f2620a3);
    BOOST_CHECK_EQUAL(TestDouble(-2.8366718125941117e+81), 0xd0d7ec7e754b394a);
    BOOST_CHECK_EQUAL(TestDouble(-1.2754409481684012e+229), 0xef80d32f8ec55342);
    BOOST_CHECK_EQUAL(TestDouble(6.000577060053642e-186), 0x197a1be7c8209b6a);
    BOOST_CHECK_EQUAL(TestDouble(2.0839423284378986e-302), 0x014c94f8689cb0a5);
    BOOST_CHECK_EQUAL(TestDouble(-1.422140051483753e+259), 0xf5bd99271d04bb35);
    BOOST_CHECK_EQUAL(TestDouble(-1.0593973991188853e+46), 0xc97db0cdb72d1046);
    BOOST_CHECK_EQUAL(TestDouble(2.62945125875249e+190), 0x67779b36366c993b);
    BOOST_CHECK_EQUAL(TestDouble(-2.920377657275094e+115), 0xd7e7b7b45908e23b);
    BOOST_CHECK_EQUAL(TestDouble(9.790289014855851e-118), 0x27a3c031cc428bcc);
    BOOST_CHECK_EQUAL(TestDouble(-4.629317182034961e-114), 0xa866ccf0b753705a);
    BOOST_CHECK_EQUAL(TestDouble(-1.7674605603846528e+279), 0xf9e8ed383ffc3e25);
    BOOST_CHECK_EQUAL(TestDouble(2.5308171727712605e+120), 0x58ef5cd55f0ec997);
    BOOST_CHECK_EQUAL(TestDouble(-1.05034156412799e+54), 0xcb25eea1b9350fa0);

    // Test extreme values
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::min()), 0x10000000000000);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::min()), 0x8010000000000000);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::max()), 0x7fefffffffffffff);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::max()), 0xffefffffffffffff);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::lowest()), 0xffefffffffffffff);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::lowest()), 0x7fefffffffffffff);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::denorm_min()), 0x1);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::denorm_min()), 0x8000000000000001);
    // Note that all NaNs are encoded the same way.
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::quiet_NaN()), 0x7ff8000000000000);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::quiet_NaN()), 0x7ff8000000000000);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::signaling_NaN()), 0x7ff8000000000000);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::signaling_NaN()), 0x7ff8000000000000);

    // Construct doubles to test from the encoding.
    static_assert(sizeof(double) == 8);
    static_assert(sizeof(uint64_t) == 8);
    for (int j = 0; j < 1000; ++j) {
        // Iterate over 9 specific bits exhaustively; the others are chosen randomly.
        // These specific bits are the sign bit, and the 2 top and bottom bits of
        // exponent and mantissa in the IEEE754 binary64 format.
        for (int x = 0; x < 512; ++x) {
            uint64_t v = m_rng.randbits(64);
            int x_pos = 0;
            for (int v_pos : {0, 1, 50, 51, 52, 53, 61, 62, 63}) {
                v &= ~(uint64_t{1} << v_pos);
                if ((x >> (x_pos++)) & 1) v |= (uint64_t{1} << v_pos);
            }
            double f;
            memcpy(&f, &v, 8);
            TestDouble(f);
        }
    }
}